

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SViewFrustum.h
# Opt level: O1

void __thiscall
irr::scene::SViewFrustum::setFrom(SViewFrustum *this,matrix4 *mat,bool zClipFromZero)

{
  float *pfVar1;
  float *pfVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  undefined3 in_register_00000011;
  long lVar6;
  float fVar7;
  
  this->planes[2].Normal.X = mat->M[3] + mat->M[0];
  this->planes[2].Normal.Y = mat->M[7] + mat->M[4];
  this->planes[2].Normal.Z = mat->M[0xb] + mat->M[8];
  this->planes[2].D = mat->M[0xf] + mat->M[0xc];
  this->planes[3].Normal.X = mat->M[3] - mat->M[0];
  this->planes[3].Normal.Y = mat->M[7] - mat->M[4];
  this->planes[3].Normal.Z = mat->M[0xb] - mat->M[8];
  this->planes[3].D = mat->M[0xf] - mat->M[0xc];
  this->planes[5].Normal.X = mat->M[3] - mat->M[1];
  this->planes[5].Normal.Y = mat->M[7] - mat->M[5];
  this->planes[5].Normal.Z = mat->M[0xb] - mat->M[9];
  this->planes[5].D = mat->M[0xf] - mat->M[0xd];
  this->planes[4].Normal.X = mat->M[3] + mat->M[1];
  this->planes[4].Normal.Y = mat->M[7] + mat->M[5];
  this->planes[4].Normal.Z = mat->M[0xb] + mat->M[9];
  this->planes[4].D = mat->M[0xf] + mat->M[0xd];
  this->planes[0].Normal.X = mat->M[3] - mat->M[2];
  this->planes[0].Normal.Y = mat->M[7] - mat->M[6];
  this->planes[0].Normal.Z = mat->M[0xb] - mat->M[10];
  this->planes[0].D = mat->M[0xf] - mat->M[0xe];
  if (CONCAT31(in_register_00000011,zClipFromZero) == 0) {
    this->planes[1].Normal.X = mat->M[3] + mat->M[2];
    this->planes[1].Normal.Y = mat->M[7] + mat->M[6];
    this->planes[1].Normal.Z = mat->M[0xb] + mat->M[10];
    fVar7 = mat->M[0xf] + mat->M[0xe];
  }
  else {
    this->planes[1].Normal.X = mat->M[2];
    this->planes[1].Normal.Y = mat->M[6];
    this->planes[1].Normal.Z = mat->M[10];
    fVar7 = mat->M[0xe];
  }
  this->planes[1].D = fVar7;
  lVar6 = 0x14;
  do {
    fVar7 = *(float *)((long)this->planes + lVar6 + -0x14);
    fVar3 = *(float *)((long)(this->planes + -1) + lVar6);
    fVar4 = *(float *)((long)this->planes + lVar6 + -0xc);
    fVar7 = fVar4 * fVar4 + fVar7 * fVar7 + fVar3 * fVar3;
    if (fVar7 < 0.0) {
      fVar7 = sqrtf(fVar7);
    }
    else {
      fVar7 = SQRT(fVar7);
    }
    fVar7 = -1.0 / fVar7;
    pfVar1 = (float *)((long)this->planes + lVar6 + -0x14);
    fVar3 = pfVar1[1];
    fVar4 = pfVar1[2];
    fVar5 = pfVar1[3];
    pfVar2 = (float *)((long)this->planes + lVar6 + -0x14);
    *pfVar2 = fVar7 * *pfVar1;
    pfVar2[1] = fVar7 * fVar3;
    pfVar2[2] = fVar7 * fVar4;
    pfVar2[3] = fVar7 * fVar5;
    lVar6 = lVar6 + 0x10;
  } while (lVar6 != 0x74);
  recalculateBoundingBox(this);
  return;
}

Assistant:

inline void SViewFrustum::setFrom(const core::matrix4 &mat, bool zClipFromZero)
{
	// left clipping plane
	planes[VF_LEFT_PLANE].Normal.X = mat[3] + mat[0];
	planes[VF_LEFT_PLANE].Normal.Y = mat[7] + mat[4];
	planes[VF_LEFT_PLANE].Normal.Z = mat[11] + mat[8];
	planes[VF_LEFT_PLANE].D = mat[15] + mat[12];

	// right clipping plane
	planes[VF_RIGHT_PLANE].Normal.X = mat[3] - mat[0];
	planes[VF_RIGHT_PLANE].Normal.Y = mat[7] - mat[4];
	planes[VF_RIGHT_PLANE].Normal.Z = mat[11] - mat[8];
	planes[VF_RIGHT_PLANE].D = mat[15] - mat[12];

	// top clipping plane
	planes[VF_TOP_PLANE].Normal.X = mat[3] - mat[1];
	planes[VF_TOP_PLANE].Normal.Y = mat[7] - mat[5];
	planes[VF_TOP_PLANE].Normal.Z = mat[11] - mat[9];
	planes[VF_TOP_PLANE].D = mat[15] - mat[13];

	// bottom clipping plane
	planes[VF_BOTTOM_PLANE].Normal.X = mat[3] + mat[1];
	planes[VF_BOTTOM_PLANE].Normal.Y = mat[7] + mat[5];
	planes[VF_BOTTOM_PLANE].Normal.Z = mat[11] + mat[9];
	planes[VF_BOTTOM_PLANE].D = mat[15] + mat[13];

	// far clipping plane
	planes[VF_FAR_PLANE].Normal.X = mat[3] - mat[2];
	planes[VF_FAR_PLANE].Normal.Y = mat[7] - mat[6];
	planes[VF_FAR_PLANE].Normal.Z = mat[11] - mat[10];
	planes[VF_FAR_PLANE].D = mat[15] - mat[14];

	// near clipping plane
	if (zClipFromZero) {
		planes[VF_NEAR_PLANE].Normal.X = mat[2];
		planes[VF_NEAR_PLANE].Normal.Y = mat[6];
		planes[VF_NEAR_PLANE].Normal.Z = mat[10];
		planes[VF_NEAR_PLANE].D = mat[14];
	} else {
		// near clipping plane
		planes[VF_NEAR_PLANE].Normal.X = mat[3] + mat[2];
		planes[VF_NEAR_PLANE].Normal.Y = mat[7] + mat[6];
		planes[VF_NEAR_PLANE].Normal.Z = mat[11] + mat[10];
		planes[VF_NEAR_PLANE].D = mat[15] + mat[14];
	}

	// normalize normals
	u32 i;
	for (i = 0; i != VF_PLANE_COUNT; ++i) {
		const f32 len = -core::reciprocal_squareroot(
				planes[i].Normal.getLengthSQ());
		planes[i].Normal *= len;
		planes[i].D *= len;
	}

	// make bounding box
	recalculateBoundingBox();
}